

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setSliceAttributes(SlicePlane *this,ShaderProgram *p)

{
  VolumeMesh *this_00;
  const_reference pvVar1;
  reference this_01;
  reference pvVar2;
  long *in_RSI;
  long in_RDI;
  int i_2;
  int i_1;
  array<unsigned_int,_8UL> *cell;
  size_t iC;
  int i;
  size_t cellCount;
  VolumeMesh *meshToInspect;
  size_type in_stack_fffffffffffffe28;
  array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL> *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe50;
  long *plVar3;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  value_type_conflict3 vVar4;
  ManagedBuffer<unsigned_int> *indices;
  undefined1 local_150 [23];
  allocator local_139;
  string local_138 [32];
  undefined1 local_118 [23];
  allocator local_101;
  string local_100 [32];
  undefined1 local_e0 [23];
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [23];
  allocator local_91;
  string local_90 [32];
  int local_70;
  int local_6c;
  reference local_68;
  size_type local_60;
  int local_54;
  size_t local_50;
  undefined8 local_18;
  long *local_10;
  
  indices = (ManagedBuffer<unsigned_int> *)&stack0xffffffffffffffc8;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)indices,(string *)(in_RDI + 0x1b0));
  this_00 = getVolumeMesh((string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  local_18 = this_00;
  local_50 = VolumeMesh::nCells((VolumeMesh *)0x461a3b);
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::operator[]
              ((array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *)
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  for (local_60 = 0; local_60 < local_50; local_60 = local_60 + 1) {
    local_68 = std::
               vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
               ::operator[]((vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
                             *)(local_18 + 0xc50),local_60);
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      pvVar1 = std::array<unsigned_int,_8UL>::operator[]
                         ((array<unsigned_int,_8UL> *)in_stack_fffffffffffffe30,
                          in_stack_fffffffffffffe28);
      vVar4 = *pvVar1;
      this_01 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::
                operator[]((array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *)
                           in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_01,local_60);
      *pvVar2 = vVar4;
    }
  }
  for (local_70 = 0; plVar3 = local_10, local_70 < 4; local_70 = local_70 + 1) {
    std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::operator[]
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    render::ManagedBuffer<unsigned_int>::markHostBufferUpdated
              ((ManagedBuffer<unsigned_int> *)in_stack_fffffffffffffe30);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"a_slice_1",&local_91);
  std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::operator[]
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,indices);
  (**(code **)(*plVar3 + 0x98))(plVar3,local_90,local_a8);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x461c7f);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"a_slice_2",&local_c9);
  std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::operator[]
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,indices);
  (**(code **)(*plVar3 + 0x98))(plVar3,local_c8,local_e0);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x461d43);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"a_slice_3",&local_101);
  std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::operator[]
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,indices);
  (**(code **)(*plVar3 + 0x98))(plVar3,local_100,local_118);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x461e07);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"a_slice_4",&local_139);
  std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::operator[]
            ((array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL> *)(local_18 + 0x428),
             in_stack_fffffffffffffe28);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,indices);
  (**(code **)(*local_10 + 0x98))(local_10,local_138,local_150);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x461ecb);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  return;
}

Assistant:

void SlicePlane::setSliceAttributes(render::ShaderProgram& p) {
  VolumeMesh* meshToInspect = polyscope::getVolumeMesh(inspectedMeshName);


  size_t cellCount = meshToInspect->nCells();
  for (int i = 0; i < 4; i++) {
    sliceBufferDataArr[i].resize(cellCount);
  }
  for (size_t iC = 0; iC < cellCount; iC++) {
    const std::array<uint32_t, 8>& cell = meshToInspect->cells[iC];
    for (int i = 0; i < 4; i++) {
      sliceBufferDataArr[i][iC] = cell[i];
    }
  }

  for (int i = 0; i < 4; i++) {
    sliceBufferArr[i].markHostBufferUpdated();
  }

  p.setAttribute("a_slice_1", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[0]));
  p.setAttribute("a_slice_2", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[1]));
  p.setAttribute("a_slice_3", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[2]));
  p.setAttribute("a_slice_4", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[3]));
}